

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O1

void net_update(net_t *n)

{
  layer *plVar1;
  net_t *pnVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  branch_layer_t *me;
  long lVar6;
  
  if (n->method != TRAIN_FORWARD) {
    if (n->method == TRAIN_ADAM) {
      if (0 < n->size) {
        lVar6 = 0;
        do {
          iVar3 = is_branch_layer(n->layer[lVar6]);
          plVar1 = n->layer[lVar6];
          if (iVar3 == 0) {
            data_update_adam(&plVar1->weight,(double)n->rate,n->t);
            plVar1 = n->layer[lVar6];
            iVar3 = n->t;
            n->t = iVar3 + 1;
            data_update_adam(&plVar1->bias,(double)n->rate,iVar3);
          }
          else if (0 < *(int *)&plVar1[1].func) {
            lVar4 = 8;
            lVar5 = 0;
            do {
              pnVar2 = *(net_t **)((long)plVar1[1].in.val + lVar4);
              pnVar2->rate = n->rate;
              net_update(pnVar2);
              lVar5 = lVar5 + 1;
              lVar4 = lVar4 + 0x10;
            } while (lVar5 < *(int *)&plVar1[1].func);
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < n->size);
      }
    }
    else if (0 < n->size) {
      lVar6 = 0;
      do {
        iVar3 = is_branch_layer(n->layer[lVar6]);
        if (iVar3 == 0) {
          (**(code **)(&DAT_00104d60 + (ulong)n->method * 8))
                    ((double)n->rate,&n->layer[lVar6]->weight);
          (**(code **)(&DAT_00104d60 + (ulong)n->method * 8))
                    ((double)n->rate,&n->layer[lVar6]->bias);
        }
        else {
          plVar1 = n->layer[lVar6];
          if (0 < *(int *)&plVar1[1].func) {
            lVar5 = 8;
            lVar4 = 0;
            do {
              pnVar2 = *(net_t **)((long)plVar1[1].in.val + lVar5);
              pnVar2->rate = n->rate;
              net_update(pnVar2);
              lVar4 = lVar4 + 1;
              lVar5 = lVar5 + 0x10;
            } while (lVar4 < *(int *)&plVar1[1].func);
          }
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < n->size);
    }
  }
  return;
}

Assistant:

void net_update(net_t *n)
{
	int i = 0;
	void (*update[TRAIN_MAX])(data_t *, double) = {
		NULL,
		data_update_sgd,
		data_update_momentum,
		data_update_momentum,
		data_update_adagrad,
		data_update_adadelta,
		NULL};

	if (update[n->method])
		for (i = 0; i < n->size; ++i)
		{
			if (!is_branch_layer(n->layer[i]))
			{
				update[n->method](&n->layer[i]->weight, n->rate);
				update[n->method](&n->layer[i]->bias, n->rate);
			} else {
				branch_layer_t *me = (branch_layer_t *)n->layer[i];
				for (int j = 0; j < me->num; ++j)
				{
					me->branch[j].n->rate = n->rate;
					net_update(me->branch[j].n);
				}
			}
		}
	else if (n->method == TRAIN_ADAM)
		for (i = 0; i < n->size; ++i)
		{
			if (!is_branch_layer(n->layer[i]))
			{
				data_update_adam(&n->layer[i]->weight, n->rate, n->t);
				data_update_adam(&n->layer[i]->bias, n->rate, n->t++);
			} else {
				branch_layer_t *me = (branch_layer_t *)n->layer[i];
				for (int j = 0; j < me->num; ++j)
				{
					me->branch[j].n->rate = n->rate;
					net_update(me->branch[j].n);
				}
			}
		}
}